

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O2

SRC_STATE * src_new(int converter_type,int channels,int *error)

{
  SRC_STATE *pSVar1;
  int converter_type_00;
  SRC_ERROR temp_error;
  
  switch(converter_type) {
  case 0:
    converter_type_00 = 0;
    break;
  case 1:
    converter_type_00 = 1;
    break;
  case 2:
    converter_type_00 = 2;
    break;
  case 3:
    pSVar1 = zoh_state_new(channels,&temp_error);
    goto LAB_00102e23;
  case 4:
    pSVar1 = linear_state_new(channels,&temp_error);
    goto LAB_00102e23;
  default:
    temp_error = SRC_ERR_BAD_CONVERTER;
    pSVar1 = (SRC_STATE *)0x0;
    goto LAB_00102e23;
  }
  pSVar1 = sinc_state_new(converter_type_00,channels,&temp_error);
LAB_00102e23:
  if (error != (int *)0x0) {
    *error = temp_error;
  }
  return pSVar1;
}

Assistant:

SRC_STATE *
src_new (int converter_type, int channels, int *error)
{
	return psrc_set_converter (converter_type, channels, error) ;
}